

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

void __thiscall
Memory::HeapBlockMap32::VerifyMarkCountForPages<2048u>
          (HeapBlockMap32 *this,void *address,uint pageCount)

{
  L2MapChunk *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BVIndex BVar4;
  undefined4 *puVar5;
  PageMarkBitVector *this_01;
  uint local_30;
  uint markCountForPage;
  uint i;
  uint id2;
  L2MapChunk *l2map;
  uint id1;
  uint pageCount_local;
  void *address_local;
  HeapBlockMap32 *this_local;
  
  uVar3 = GetLevel1Id(address);
  this_00 = this->map[uVar3];
  if (this_00 == (L2MapChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x15e,"(l2map != nullptr)","l2map != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar3 = GetLevel2Id(address);
  local_30 = uVar3;
  if (0x100 < uVar3 + pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x162,"(id2 + pageCount <= L2Count)","id2 + pageCount <= L2Count");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  do {
    if (pageCount + uVar3 <= local_30) {
      return;
    }
    this_01 = L2MapChunk::GetPageMarkBitVector(this_00,local_30);
    BVar4 = BVStatic<256UL>::Count(this_01);
    if (BVar4 != this_00->pageMarkCount[local_30]) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0x16a,"(markCountForPage == l2map->pageMarkCount[i])",
                         "markCountForPage == l2map->pageMarkCount[i]");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void
HeapBlockMap32::VerifyMarkCountForPages(void * address, uint pageCount)
{
    uint id1 = GetLevel1Id(address);

    L2MapChunk * l2map = map[id1];
    Assert(l2map != nullptr);

    uint id2 = GetLevel2Id(address);

    Assert(id2 + pageCount <= L2Count);
    for (uint i = id2; i < pageCount + id2; i++)
    {
        uint markCountForPage = l2map->GetPageMarkBitVector(i)->Count();
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        DebugOnly(HeapBlock * heapBlock = this->GetHeapBlock(address));
        Assert(markCountForPage == l2map->pageMarkCount[i] || heapBlock->WasAllocatedFromDuringSweep());
#else
        Assert(markCountForPage == l2map->pageMarkCount[i]);
#endif
    }
}